

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O2

int regexec(regex_t *__preg,char *__string,size_t __nmatch,regmatch_t *__pmatch,int __eflags)

{
  undefined8 *puVar1;
  re_guts *prVar2;
  sopno sVar3;
  long lVar4;
  undefined8 uVar5;
  char *bef;
  regmatch_t *prVar6;
  size_t sVar7;
  int iVar8;
  uint bef_00;
  uint st;
  uint bef_01;
  uint uVar9;
  int iVar10;
  regmatch_t rVar11;
  char *pcVar12;
  ushort **ppuVar13;
  regmatch_t *prVar14;
  char *pcVar15;
  ushort *puVar16;
  ushort uVar17;
  regoff_t *prVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  char *pcVar22;
  long lVar23;
  undefined8 *puVar24;
  int iVar25;
  char *pcVar26;
  size_t sVar27;
  long lVar28;
  bool bVar29;
  int local_e4;
  lmat local_c8;
  size_t local_58;
  char *local_50;
  regmatch_t *local_48;
  re_guts *local_40;
  char *local_38;
  
  if (*(int *)&__preg->buffer != 0xf265) {
    return 2;
  }
  prVar2 = (re_guts *)__preg->syntax;
  if (prVar2->magic != 0xd245) {
    return 2;
  }
  if ((prVar2->iflags & 4) != 0) {
    __assert_fail("!(g->iflags&BAD)",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regexec.c"
                  ,0x79,"int regexec()");
  }
  uVar19 = prVar2->nstates;
  local_c8.eflags = __eflags;
  local_c8.offp = __string;
  local_48 = __pmatch;
  local_40 = prVar2;
  if (((uint)__eflags >> 9 & 1) == 0 && uVar19 < 0x21) {
    lVar28 = prVar2->firststate;
    sVar3 = prVar2->laststate;
    local_58 = 0;
    if ((prVar2->cflags & 4) == 0) {
      local_58 = __nmatch;
    }
    if ((__eflags & 4U) == 0) {
      rVar11 = (regmatch_t)strlen(__string);
      pcVar22 = __string;
    }
    else {
      pcVar22 = __string + (long)*__pmatch;
      rVar11 = __pmatch[1];
    }
    pcVar12 = __string + (long)rVar11;
    lVar23 = (long)pcVar12 - (long)pcVar22;
    if (pcVar12 < pcVar22) {
      return 0x10;
    }
    pcVar15 = local_40->must;
    pcVar26 = pcVar22;
    if (pcVar15 != (char *)0x0) {
      for (; pcVar26 < pcVar12; pcVar26 = pcVar26 + 1) {
        if ((*pcVar26 == *pcVar15) && (local_40->mlen <= lVar23)) {
          iVar8 = bcmp(pcVar26,pcVar15,(long)local_40->mlen);
          if (iVar8 == 0) break;
        }
        lVar23 = lVar23 + -1;
      }
      if (pcVar26 == pcVar12) {
        return 1;
      }
    }
    local_c8.g = local_40;
    local_c8.pmatch = (regmatch_t *)0x0;
    local_c8.lastpos = (char **)0x0;
    lVar28 = lVar28 + 1;
    bef_00 = 1 << ((byte)lVar28 & 0x1f);
    local_50 = (char *)CONCAT44(local_50._4_4_,1 << ((byte)sVar3 & 0x1f));
    local_c8._68_4_ = 0;
    local_c8.space = (char *)0x0;
    local_c8.st._0_4_ = 0;
    local_c8.beginp = pcVar22;
    local_c8.endp = pcVar12;
LAB_00105afa:
    if (local_c8.beginp == pcVar22) {
      iVar8 = 0x80;
    }
    else {
      iVar8 = (int)pcVar22[-1];
    }
    st = sstep(local_c8.g,lVar28,sVar3,bef_00,0x84,bef_00);
    sprint((smat *)&local_c8,"start",st,(int)*pcVar22,_stdout);
    pcVar15 = (char *)0x0;
    local_38 = (char *)CONCAT44(local_38._4_4_,st);
    bef_01 = st;
    do {
      if (pcVar22 == local_c8.endp) {
        iVar25 = 0x80;
      }
      else {
        iVar25 = (int)*pcVar22;
      }
      if (bef_01 == st) {
        pcVar15 = pcVar22;
      }
      iVar10 = 0;
      iVar21 = 0x82;
      if (iVar8 == 0x80) {
        iVar20 = 0;
        iVar10 = 0;
        if ((local_c8.eflags & 1U) == 0) {
LAB_00105bbb:
          iVar20 = (local_c8.g)->nbol;
          iVar21 = 0x83;
          iVar10 = 0x81;
        }
      }
      else if (iVar8 == 10) {
        iVar20 = 0;
        if (((local_c8.g)->cflags & 8) != 0) goto LAB_00105bbb;
      }
      else {
        iVar20 = 0;
        iVar10 = 0;
      }
      if (iVar25 == 0x80) {
        if ((local_c8.eflags & 2U) == 0) goto LAB_00105bf5;
      }
      else if ((iVar25 == 10) && (((local_c8.g)->cflags & 8) != 0)) {
LAB_00105bf5:
        iVar20 = iVar20 + (local_c8.g)->neol;
        iVar10 = iVar21;
      }
      if (iVar20 != 0) {
        for (; 0 < iVar20; iVar20 = iVar20 + -1) {
          bef_01 = sstep(local_c8.g,lVar28,sVar3,bef_01,iVar10,bef_01);
        }
        sprint((smat *)&local_c8,"boleol",bef_01,iVar25,_stdout);
      }
      if (iVar10 == 0x81) {
        iVar21 = 0x81;
        if (iVar25 != 0x80) {
          ppuVar13 = __ctype_b_loc();
          puVar16 = *ppuVar13;
LAB_00105cb2:
          if (iVar25 == 0x5f) {
            iVar10 = 0x85;
          }
          iVar21 = iVar10;
          if ((puVar16[iVar25] & 8) != 0) {
            iVar21 = 0x85;
          }
        }
        iVar10 = iVar21;
        if (iVar8 == 0x80) goto LAB_00105d08;
        ppuVar13 = __ctype_b_loc();
        puVar16 = *ppuVar13;
        uVar17 = puVar16[iVar8] & 8;
LAB_00105cfe:
        if (((uVar17 == 0) && (iVar8 != 0x5f)) ||
           ((iVar8 = 0x86, iVar10 != 0x82 &&
            (((iVar25 == 0x80 || ((puVar16[iVar25] & 8) != 0)) || (iVar25 == 0x5f))))))
        goto LAB_00105d08;
LAB_00105d2a:
        bef_01 = sstep(local_c8.g,lVar28,sVar3,bef_01,iVar8,bef_01);
        sprint((smat *)&local_c8,"boweow",bef_01,iVar25,_stdout);
      }
      else {
        if (iVar8 != 0x80) {
          ppuVar13 = __ctype_b_loc();
          puVar16 = *ppuVar13;
          uVar17 = puVar16[iVar8] & 8;
          if (((uVar17 == 0) && (iVar8 != 0x5f)) && (iVar25 != 0x80)) goto LAB_00105cb2;
          goto LAB_00105cfe;
        }
LAB_00105d08:
        iVar8 = iVar10;
        if (iVar10 - 0x85U < 2) goto LAB_00105d2a;
      }
      prVar2 = local_40;
      if ((pcVar22 == pcVar12) || ((bef_01 & (uint)local_50) != 0)) goto LAB_00105e3a;
      if (iVar25 == 0x80) {
        pcVar22 = "char *sfast()";
        goto LAB_00106b5d;
      }
      st = (uint)local_38;
      bef_01 = sstep(local_c8.g,lVar28,sVar3,bef_01,iVar25,(uint)local_38);
      sprint((smat *)&local_c8,"aft",bef_01,iVar25,_stdout);
      uVar9 = sstep(local_c8.g,lVar28,sVar3,bef_01,0x84,bef_01);
      pcVar22 = pcVar22 + 1;
      iVar8 = iVar25;
      if (uVar9 != bef_01) {
        __assert_fail("EQ(step(m->g, startst, stopst, st, NOTHING, st), st)",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0x2cc,"char *sfast()");
      }
    } while( true );
  }
  lVar28 = prVar2->firststate;
  sVar3 = prVar2->laststate;
  local_58 = 0;
  if ((prVar2->cflags & 4) == 0) {
    local_58 = __nmatch;
  }
  if ((__eflags & 4U) == 0) {
    rVar11 = (regmatch_t)strlen(__string);
    pcVar22 = __string;
  }
  else {
    pcVar22 = __string + (long)*__pmatch;
    rVar11 = __pmatch[1];
  }
  pcVar12 = __string + (long)rVar11;
  lVar23 = (long)pcVar12 - (long)pcVar22;
  if (pcVar12 < pcVar22) {
    return 0x10;
  }
  pcVar15 = prVar2->must;
  local_50 = pcVar22;
  if (pcVar15 != (char *)0x0) {
    while ((pcVar22 < pcVar12 &&
           (((*pcVar22 != *pcVar15 || (lVar23 < prVar2->mlen)) ||
            (iVar8 = bcmp(pcVar22,pcVar15,(long)prVar2->mlen), iVar8 != 0))))) {
      pcVar22 = pcVar22 + 1;
      lVar23 = lVar23 + -1;
    }
    if (pcVar22 == pcVar12) {
      return 1;
    }
  }
  pcVar22 = local_50;
  local_c8.pmatch = (regmatch_t *)0x0;
  local_c8.lastpos = (char **)0x0;
  local_c8.beginp = local_50;
  local_c8.g = prVar2;
  local_c8.endp = pcVar12;
  local_c8.space = (char *)malloc(uVar19 * 4);
  if (local_c8.space == (char *)0x0) {
    return 0xc;
  }
  lVar28 = lVar28 + 1;
  local_c8.st._0_4_ = SUB84(local_c8.space,0);
  local_c8.st._4_4_ = (undefined4)((ulong)local_c8.space >> 0x20);
  local_c8.fresh = local_c8.space + uVar19;
  local_c8.tmp = local_c8.space + uVar19 * 2;
  local_c8.vn = 4;
  local_c8.empty = local_c8.space + uVar19 * 3;
  memset(local_c8.empty,0,uVar19);
  local_e4 = 0xc;
LAB_001061f5:
  pcVar26 = local_c8.tmp;
  pcVar15 = local_c8.fresh;
  if (local_c8.beginp == pcVar22) {
    iVar8 = 0x80;
  }
  else {
    iVar8 = (int)pcVar22[-1];
  }
  bef = (char *)CONCAT44(local_c8.st._4_4_,local_c8.st._0_4_);
  memset(bef,0,(local_c8.g)->nstates);
  bef[lVar28] = '\x01';
  lstep(local_c8.g,lVar28,sVar3,bef,0x84,bef);
  local_38 = pcVar15;
  memcpy(pcVar15,bef,(local_c8.g)->nstates);
  lprint(&local_c8,"start",bef,(int)*pcVar22,_stdout);
  pcVar15 = (char *)0x0;
  do {
    prVar2 = local_c8.g;
    if (pcVar22 == local_c8.endp) {
      iVar25 = 0x80;
    }
    else {
      iVar25 = (int)*pcVar22;
    }
    iVar10 = bcmp(bef,local_38,(local_c8.g)->nstates);
    if (iVar10 == 0) {
      pcVar15 = pcVar22;
    }
    iVar10 = 0;
    iVar21 = 0x82;
    if (iVar8 == 0x80) {
      iVar20 = 0;
      if ((local_c8.eflags & 1U) == 0) {
LAB_0010631f:
        iVar20 = prVar2->nbol;
        iVar10 = 0x81;
        iVar21 = 0x83;
      }
    }
    else if (iVar8 == 10) {
      iVar20 = 0;
      if ((prVar2->cflags & 8) != 0) goto LAB_0010631f;
    }
    else {
      iVar20 = 0;
    }
    if (iVar25 == 0x80) {
      if ((local_c8.eflags & 2U) == 0) goto LAB_00106353;
    }
    else if ((iVar25 == 10) && ((prVar2->cflags & 8) != 0)) {
LAB_00106353:
      iVar20 = iVar20 + prVar2->neol;
      iVar10 = iVar21;
    }
    local_50 = pcVar22;
    if (iVar20 != 0) {
      for (; 0 < iVar20; iVar20 = iVar20 + -1) {
        lstep(local_c8.g,lVar28,sVar3,bef,iVar10,bef);
      }
      lprint(&local_c8,"boleol",bef,iVar25,_stdout);
    }
    if (iVar10 == 0x81) {
      iVar21 = 0x81;
      if (iVar25 != 0x80) {
        ppuVar13 = __ctype_b_loc();
        puVar16 = *ppuVar13;
LAB_0010641e:
        if (iVar25 == 0x5f) {
          iVar10 = 0x85;
        }
        iVar21 = iVar10;
        if ((puVar16[iVar25] & 8) != 0) {
          iVar21 = 0x85;
        }
      }
      iVar10 = iVar21;
      if (iVar8 == 0x80) goto LAB_00106478;
      ppuVar13 = __ctype_b_loc();
      puVar16 = *ppuVar13;
      uVar17 = puVar16[iVar8] & 8;
LAB_00106469:
      if (((uVar17 == 0) && (iVar8 != 0x5f)) ||
         ((iVar8 = 0x86, iVar10 != 0x82 &&
          (((iVar25 == 0x80 || ((puVar16[iVar25] & 8) != 0)) || (iVar25 == 0x5f))))))
      goto LAB_00106478;
LAB_0010649c:
      lstep(local_c8.g,lVar28,sVar3,bef,iVar8,bef);
      lprint(&local_c8,"boweow",bef,iVar25,_stdout);
    }
    else {
      if (iVar8 != 0x80) {
        ppuVar13 = __ctype_b_loc();
        puVar16 = *ppuVar13;
        uVar17 = puVar16[iVar8] & 8;
        if (((uVar17 == 0) && (iVar8 != 0x5f)) && (iVar25 != 0x80)) goto LAB_0010641e;
        goto LAB_00106469;
      }
LAB_00106478:
      iVar8 = iVar10;
      if (iVar10 - 0x85U < 2) goto LAB_0010649c;
    }
    prVar2 = local_40;
    pcVar22 = local_50;
    sVar7 = local_58;
    if ((local_50 == pcVar12) || (bef[sVar3] != '\0')) goto LAB_001065eb;
    memcpy(pcVar26,bef,(local_c8.g)->nstates);
    memcpy(bef,local_38,(local_c8.g)->nstates);
    if (iVar25 == 0x80) {
      pcVar22 = "char *lfast()";
LAB_00106b5d:
      __assert_fail("c != OUT",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0x2c9,pcVar22);
    }
    lstep(local_c8.g,lVar28,sVar3,pcVar26,iVar25,bef);
    lprint(&local_c8,"aft",bef,iVar25,_stdout);
    lstep(local_c8.g,lVar28,sVar3,bef,0x84,bef);
    pcVar22 = pcVar22 + 1;
    iVar8 = iVar25;
  } while( true );
LAB_00105e3a:
  if (pcVar15 == (char *)0x0) {
    pcVar22 = "char *sfast()";
    goto LAB_00106bfd;
  }
  if (((uint)local_50 & bef_01) == 0) {
    return 1;
  }
  local_c8.coldp = pcVar15;
  if ((local_58 == 0) && (local_40->backrefs == 0)) goto LAB_001069a5;
  while( true ) {
    if ((local_c8.eflags & 0x100U) != 0) {
      printf("=%s\n","finding start");
    }
    pcVar22 = sslow((smat *)&local_c8,local_c8.coldp,pcVar12,lVar28,sVar3);
    if (pcVar22 != (char *)0x0) break;
    if (local_c8.endp <= local_c8.coldp) {
      pcVar22 = "int smatcher()";
      goto LAB_00106b7c;
    }
    local_c8.coldp = local_c8.coldp + 1;
  }
  if ((local_58 != 1) || (prVar2->backrefs != 0)) {
    sVar27 = (local_c8.g)->nsub;
    prVar14 = local_c8.pmatch;
    if ((local_c8.pmatch == (regmatch_t *)0x0) &&
       (prVar14 = (regmatch_t *)malloc(sVar27 * 0x10 + 0x10), local_c8.pmatch = prVar14,
       prVar14 == (regmatch_t *)0x0)) {
      return 0xc;
    }
    while( true ) {
      prVar6 = local_c8.pmatch;
      bVar29 = sVar27 == 0;
      sVar27 = sVar27 - 1;
      if (bVar29) break;
      *(undefined4 *)&prVar14[1].rm_so = 0xffffffff;
      *(undefined4 *)((long)&prVar14[1].rm_so + 4) = 0xffffffff;
      *(undefined4 *)&prVar14[1].rm_eo = 0xffffffff;
      *(undefined4 *)((long)&prVar14[1].rm_eo + 4) = 0xffffffff;
      prVar14 = prVar14 + 1;
    }
    if ((prVar2->backrefs == 0) && (((uint)local_c8.eflags >> 10 & 1) == 0)) {
      if (((uint)local_c8.eflags >> 8 & 1) != 0) {
        printf("=%s\n","dissecting");
      }
      pcVar15 = sdissect((smat *)&local_c8,local_c8.coldp,pcVar22,lVar28,sVar3);
    }
    else {
      lVar23 = prVar2->nplus;
      if (local_c8.lastpos == (char **)0x0 && 0 < lVar23) {
        local_c8.lastpos = (char **)malloc(lVar23 * 8 + 8);
      }
      if (local_c8.lastpos == (char **)0x0 && 0 < lVar23) {
        free(prVar6);
        return 0xc;
      }
      if ((local_c8.eflags & 0x100U) != 0) {
        printf("=%s\n","backref dissect");
      }
      pcVar15 = sbackref((smat *)&local_c8,local_c8.coldp,pcVar22,lVar28,sVar3,0);
    }
    if (pcVar15 == (char *)0x0) {
      if (prVar2->backrefs == 0) {
        pcVar22 = "int smatcher()";
        goto LAB_00106c3b;
      }
      if ((prVar2->nplus != 0) && (local_c8.lastpos == (char **)0x0)) {
        pcVar22 = "int smatcher()";
        goto LAB_00106c1c;
      }
      pcVar15 = (char *)0x0;
      while ((pcVar15 == (char *)0x0 && (local_c8.coldp < pcVar22))) {
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n","backoff");
        }
        pcVar22 = sslow((smat *)&local_c8,local_c8.coldp,pcVar22 + -1,lVar28,sVar3);
        if (pcVar22 == (char *)0x0) goto LAB_00106109;
        lVar23 = (local_c8.g)->nsub + 1;
        prVar18 = &local_c8.pmatch[1].rm_eo;
        while (lVar23 = lVar23 + -1, lVar23 != 0) {
          if (((regmatch_t *)(prVar18 + -1))->rm_so != -1) {
            pcVar22 = "int smatcher()";
            goto LAB_00106af1;
          }
          lVar4 = *prVar18;
          prVar18 = prVar18 + 2;
          if (lVar4 != -1) {
            pcVar22 = "int smatcher()";
            goto LAB_00106ad2;
          }
        }
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n","backoff dissect");
        }
        pcVar15 = sbackref((smat *)&local_c8,local_c8.coldp,pcVar22,lVar28,sVar3,0);
      }
      if ((pcVar15 != (char *)0x0) && (pcVar15 != pcVar22)) {
        pcVar22 = "int smatcher()";
        goto LAB_00106c71;
      }
      if (pcVar15 == (char *)0x0) {
LAB_00106109:
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n","false alarm");
        }
        pcVar22 = local_c8.coldp + 1;
        if (pcVar12 < pcVar22) goto code_r0x00106132;
        goto LAB_00105afa;
      }
    }
    if (local_58 == 0) goto LAB_001069a5;
  }
  *local_48 = (regmatch_t)((long)local_c8.coldp - (long)local_c8.offp);
  local_48[1] = (regmatch_t)((long)pcVar22 - (long)local_c8.offp);
  if (local_58 < 2) goto LAB_001069a5;
  if (local_c8.pmatch != (regmatch_t *)0x0) {
    lVar28 = 0x10;
    for (uVar19 = 1; local_58 != uVar19; uVar19 = uVar19 + 1) {
      puVar24 = (undefined8 *)((long)&local_48->rm_so + lVar28);
      if ((local_c8.g)->nsub < uVar19) {
        *(undefined4 *)puVar24 = 0xffffffff;
        *(undefined4 *)((long)puVar24 + 4) = 0xffffffff;
        *(undefined4 *)(puVar24 + 1) = 0xffffffff;
        *(undefined4 *)((long)puVar24 + 0xc) = 0xffffffff;
      }
      else {
        puVar1 = (undefined8 *)((long)&(local_c8.pmatch)->rm_so + lVar28);
        uVar5 = puVar1[1];
        *puVar24 = *puVar1;
        puVar24[1] = uVar5;
      }
      lVar28 = lVar28 + 0x10;
    }
LAB_001069a5:
    free(local_c8.pmatch);
    free(local_c8.lastpos);
    return 0;
  }
  pcVar22 = "int smatcher()";
  goto LAB_00106ca7;
code_r0x00106132:
  pcVar22 = "int smatcher()";
  goto LAB_00106905;
LAB_001065eb:
  if (pcVar15 == (char *)0x0) {
    pcVar22 = "char *lfast()";
LAB_00106bfd:
    __assert_fail("coldp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                  ,0x2d0,pcVar22);
  }
  local_c8.coldp = pcVar15;
  if (bef[sVar3] == '\0') {
    local_e4 = 1;
    goto LAB_00106a6f;
  }
  if ((local_58 == 0) && (local_40->backrefs == 0)) goto LAB_00106a33;
  while( true ) {
    if ((local_c8.eflags & 0x100U) != 0) {
      printf("=%s\n","finding start");
    }
    pcVar22 = lslow(&local_c8,local_c8.coldp,pcVar12,lVar28,sVar3);
    if (pcVar22 != (char *)0x0) break;
    if (local_c8.endp <= local_c8.coldp) {
      pcVar22 = "int lmatcher()";
LAB_00106b7c:
      __assert_fail("m->coldp < m->endp",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0xa2,pcVar22);
    }
    local_c8.coldp = local_c8.coldp + 1;
  }
  if ((sVar7 != 1) || (prVar2->backrefs != 0)) {
    sVar27 = (local_c8.g)->nsub;
    prVar14 = local_c8.pmatch;
    if ((local_c8.pmatch == (regmatch_t *)0x0) &&
       (prVar14 = (regmatch_t *)malloc(sVar27 * 0x10 + 0x10), local_c8.pmatch = prVar14,
       prVar14 == (regmatch_t *)0x0)) goto LAB_00106a6f;
    while( true ) {
      prVar6 = local_c8.pmatch;
      bVar29 = sVar27 == 0;
      sVar27 = sVar27 - 1;
      if (bVar29) break;
      *(undefined4 *)&prVar14[1].rm_so = 0xffffffff;
      *(undefined4 *)((long)&prVar14[1].rm_so + 4) = 0xffffffff;
      *(undefined4 *)&prVar14[1].rm_eo = 0xffffffff;
      *(undefined4 *)((long)&prVar14[1].rm_eo + 4) = 0xffffffff;
      prVar14 = prVar14 + 1;
    }
    if ((prVar2->backrefs == 0) && (((uint)local_c8.eflags >> 10 & 1) == 0)) {
      if (((uint)local_c8.eflags >> 8 & 1) != 0) {
        printf("=%s\n","dissecting");
      }
      pcVar15 = ldissect(&local_c8,local_c8.coldp,pcVar22,lVar28,sVar3);
    }
    else {
      lVar23 = prVar2->nplus;
      if (local_c8.lastpos == (char **)0x0 && 0 < lVar23) {
        local_c8.lastpos = (char **)malloc(lVar23 * 8 + 8);
      }
      if (local_c8.lastpos == (char **)0x0 && 0 < lVar23) {
        free(prVar6);
        goto LAB_00106a6f;
      }
      if ((local_c8.eflags & 0x100U) != 0) {
        printf("=%s\n","backref dissect");
      }
      pcVar15 = lbackref(&local_c8,local_c8.coldp,pcVar22,lVar28,sVar3,0);
    }
    if (pcVar15 == (char *)0x0) {
      if (prVar2->backrefs == 0) {
        pcVar22 = "int lmatcher()";
LAB_00106c3b:
        __assert_fail("g->backrefs",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0xc5,pcVar22);
      }
      if ((prVar2->nplus != 0) && (local_c8.lastpos == (char **)0x0)) {
        pcVar22 = "int lmatcher()";
LAB_00106c1c:
        __assert_fail("g->nplus == 0 || m->lastpos != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0xc6,pcVar22);
      }
      pcVar15 = (char *)0x0;
      while ((pcVar15 == (char *)0x0 && (local_c8.coldp < pcVar22))) {
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n","backoff");
        }
        pcVar22 = lslow(&local_c8,local_c8.coldp,pcVar22 + -1,lVar28,sVar3);
        if (pcVar22 == (char *)0x0) goto LAB_001068c3;
        lVar23 = (local_c8.g)->nsub + 1;
        prVar18 = &local_c8.pmatch[1].rm_eo;
        while (lVar23 = lVar23 + -1, lVar23 != 0) {
          if (((regmatch_t *)(prVar18 + -1))->rm_so != -1) {
            pcVar22 = "int lmatcher()";
LAB_00106af1:
            __assert_fail("m->pmatch[i].rm_so == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                          ,0xd1,pcVar22);
          }
          lVar4 = *prVar18;
          prVar18 = prVar18 + 2;
          if (lVar4 != -1) {
            pcVar22 = "int lmatcher()";
LAB_00106ad2:
            __assert_fail("m->pmatch[i].rm_eo == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                          ,0xd2,pcVar22);
          }
        }
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n","backoff dissect");
        }
        pcVar15 = lbackref(&local_c8,local_c8.coldp,pcVar22,lVar28,sVar3,0);
      }
      if ((pcVar15 != (char *)0x0) && (pcVar15 != pcVar22)) {
        pcVar22 = "int lmatcher()";
LAB_00106c71:
        __assert_fail("dp == NULL || dp == endp",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0xd8,pcVar22);
      }
      if (pcVar15 == (char *)0x0) {
LAB_001068c3:
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n");
        }
        pcVar22 = local_c8.coldp + 1;
        if (pcVar12 < pcVar22) goto code_r0x001068f0;
        goto LAB_001061f5;
      }
    }
    if (sVar7 == 0) goto LAB_00106a33;
  }
  *local_48 = (regmatch_t)((long)local_c8.coldp - (long)local_c8.offp);
  local_48[1] = (regmatch_t)((long)pcVar22 - (long)local_c8.offp);
  if (1 < sVar7) {
    if (local_c8.pmatch == (regmatch_t *)0x0) {
      pcVar22 = "int lmatcher()";
LAB_00106ca7:
      __assert_fail("m->pmatch != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0xe8,pcVar22);
    }
    lVar28 = 0x10;
    for (uVar19 = 1; sVar7 != uVar19; uVar19 = uVar19 + 1) {
      puVar24 = (undefined8 *)((long)&local_48->rm_so + lVar28);
      if ((local_c8.g)->nsub < uVar19) {
        *(undefined4 *)puVar24 = 0xffffffff;
        *(undefined4 *)((long)puVar24 + 4) = 0xffffffff;
        *(undefined4 *)(puVar24 + 1) = 0xffffffff;
        *(undefined4 *)((long)puVar24 + 0xc) = 0xffffffff;
      }
      else {
        puVar1 = (undefined8 *)((long)&(local_c8.pmatch)->rm_so + lVar28);
        uVar5 = puVar1[1];
        *puVar24 = *puVar1;
        puVar24[1] = uVar5;
      }
      lVar28 = lVar28 + 0x10;
    }
  }
LAB_00106a33:
  free(local_c8.pmatch);
  free(local_c8.lastpos);
  local_e4 = 0;
LAB_00106a6f:
  free(local_c8.space);
  return local_e4;
code_r0x001068f0:
  pcVar22 = "int lmatcher()";
LAB_00106905:
  __assert_fail("start <= stop",
                "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                ,0xdf,pcVar22);
}

Assistant:

int				/* 0 success, REG_NOMATCH failure */
regexec(preg, string, nmatch, pmatch, eflags)
const regex_t *preg;
const char *string;
size_t nmatch;
regmatch_t pmatch[];
int eflags;
{
	struct re_guts *g = preg->re_g;
#ifdef REDEBUG
#	define	GOODFLAGS(f)	(f)
#else
#	define	GOODFLAGS(f)	((f)&(REG_NOTBOL|REG_NOTEOL|REG_STARTEND))
#endif

	if (preg->re_magic != MAGIC1 || g->magic != MAGIC2)
		return(REG_BADPAT);
	assert(!(g->iflags&BAD));
	if (g->iflags&BAD)		/* backstop for no-debug case */
		return(REG_BADPAT);
	eflags = GOODFLAGS(eflags);

	if ((size_t) g->nstates <= CHAR_BIT*sizeof(states1) && !(eflags&REG_LARGE))
		return(smatcher(g, (char *)string, nmatch, pmatch, eflags));
	else
		return(lmatcher(g, (char *)string, nmatch, pmatch, eflags));
}